

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_godunov_plm.cpp
# Opt level: O2

void PLM::PredictVelOnZFace
               (Box *zebox,int ncomp,Array4<double> *Imz,Array4<double> *Ipz,Array4<const_double> *q
               ,Array4<const_double> *vcc,Geometry *geom,Real dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *pbc)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  double *pdVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  pair<bool,_bool> pVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  double *pdVar24;
  int iVar25;
  double *pdVar26;
  double *pdVar27;
  double *pdVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  double *pdVar33;
  int iVar34;
  ulong uVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  double *pdVar39;
  int iVar40;
  long lVar41;
  long lVar42;
  double *pdVar43;
  double *pdVar44;
  long lVar45;
  long lVar46;
  double *pdVar47;
  int iVar48;
  long lVar49;
  double *pdVar50;
  double *pdVar51;
  long lVar52;
  double *pdVar53;
  double *pdVar54;
  int iVar55;
  double *pdVar56;
  double *pdVar57;
  double *pdVar58;
  double *pdVar59;
  ulong uVar60;
  long lVar61;
  bool bVar62;
  bool bVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  undefined1 auVar67 [16];
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  double dVar74;
  double dVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  undefined4 uVar84;
  undefined4 uVar85;
  Real qp;
  undefined4 uVar86;
  undefined4 uVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  Real qk;
  double *local_2c0;
  Real qp_1;
  Real qk_1;
  double *local_258;
  double *local_230;
  double *local_228;
  double *local_1f0;
  double *local_1e8;
  double *local_1e0;
  double *local_1d8;
  double *local_1c8;
  double *local_1c0;
  BCRec *bc;
  double *local_138;
  double *local_128;
  double *local_118;
  double *local_100;
  double *local_f8;
  double *local_f0;
  double *local_e8;
  double *local_e0;
  double *local_d8;
  double *local_d0;
  
  dVar64 = dt / (geom->super_CoordSys).dx[2];
  iVar20 = (geom->domain).smallend.vect[2];
  iVar3 = (geom->domain).bigend.vect[2];
  lVar22 = (long)iVar3;
  pVar19 = anon_unknown.dwarf_40c4dc::has_extdir_or_ho
                     ((h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
                      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                      super__Vector_impl_data._M_start,ncomp,2);
  if ((((ushort)pVar19 & 1) == 0) || (iVar55 = (zebox->smallend).vect[2], iVar20 < iVar55 + -1)) {
    iVar4 = (zebox->bigend).vect[2];
    if (iVar4 < iVar3 || ((ushort)pVar19 >> 8 & 1) == 0) {
      lVar22 = Imz->jstride;
      lVar7 = Imz->kstride;
      lVar45 = (long)(zebox->smallend).vect[1];
      iVar20 = (zebox->smallend).vect[2];
      lVar52 = (long)iVar20;
      uVar60 = 0;
      uVar35 = (ulong)(uint)ncomp;
      if (ncomp < 1) {
        uVar35 = uVar60;
      }
      iVar3 = (zebox->smallend).vect[0];
      lVar36 = (long)iVar3;
      lVar8 = Ipz->kstride;
      lVar9 = Ipz->jstride;
      lVar23 = (long)(vcc->begin).z;
      lVar10 = vcc->kstride;
      lVar11 = vcc->jstride;
      lVar32 = (lVar45 - (vcc->begin).y) * lVar11;
      lVar12 = vcc->nstride;
      lVar41 = (long)(vcc->begin).x;
      pdVar13 = vcc->p;
      lVar14 = q->jstride;
      lVar42 = (lVar45 - (q->begin).y) * lVar14;
      iVar55 = (q->begin).z;
      iVar20 = iVar20 - iVar55;
      lVar46 = (long)(q->begin).x;
      lVar15 = q->kstride;
      pdVar28 = q->p;
      local_258 = pdVar28 + ((lVar42 + lVar36) - lVar46);
      pdVar54 = pdVar28 + ((((lVar52 + -1) - (long)iVar55) * lVar15 + lVar42 + lVar36) - lVar46);
      pdVar28 = pdVar28 + (((lVar52 - iVar55) * lVar15 + lVar42 + lVar36) - lVar46);
      lVar46 = q->nstride;
      pdVar57 = Imz->p + ((lVar36 + (lVar52 - (Imz->begin).z) * lVar7 +
                                    (lVar45 - (Imz->begin).y) * lVar22) - (long)(Imz->begin).x);
      pdVar26 = Ipz->p + ((lVar36 + ((lVar52 - (Ipz->begin).z) + -1) * lVar8 +
                                    (lVar45 - (Ipz->begin).y) * lVar9) - (long)(Ipz->begin).x);
      lVar16 = Ipz->nstride;
      lVar17 = Imz->nstride;
      iVar55 = (zebox->bigend).vect[0];
      iVar5 = (zebox->bigend).vect[1];
      lVar42 = lVar15 * 8;
      for (; pdVar50 = pdVar28, pdVar39 = pdVar54,
          pdVar44 = pdVar13 + ((lVar36 + lVar12 * 2 + (lVar52 - lVar23) * lVar10 + lVar32) - lVar41)
          , lVar61 = lVar52, iVar40 = iVar20 + -2, iVar29 = iVar20 + 2, iVar21 = iVar20 + -3,
          local_1d8 = pdVar13 + ((lVar36 + lVar12 * 2 + ((lVar52 + -1) - lVar23) * lVar10 + lVar32)
                                - lVar41), local_138 = pdVar57, local_128 = pdVar26, iVar48 = iVar20
          , uVar60 != uVar35; uVar60 = uVar60 + 1) {
        while (iVar48 = iVar48 + 1, lVar61 <= iVar4) {
          pdVar27 = (double *)(iVar21 * lVar42 + (long)local_258);
          pdVar33 = (double *)(iVar29 * lVar42 + (long)local_258);
          pdVar43 = (double *)(iVar40 * lVar42 + (long)local_258);
          pdVar59 = (double *)(iVar48 * lVar42 + (long)local_258);
          lVar61 = lVar61 + 1;
          pdVar24 = local_1d8;
          pdVar47 = local_128;
          pdVar51 = pdVar50;
          pdVar53 = local_138;
          pdVar56 = pdVar44;
          pdVar58 = pdVar39;
          for (lVar49 = lVar45; lVar49 <= iVar5; lVar49 = lVar49 + 1) {
            if (iVar3 <= iVar55) {
              lVar37 = 0;
              do {
                dVar1 = pdVar51[lVar37];
                dVar2 = pdVar58[lVar37];
                dVar81 = dVar2 - pdVar43[lVar37];
                dVar83 = dVar1 - dVar2;
                dVar93 = 0.0;
                dVar69 = ABS(dVar81);
                dVar70 = ABS(dVar83);
                dVar89 = 0.0;
                if (0.0 <= dVar83 * dVar81) {
                  dVar89 = dVar70;
                  if (dVar69 <= dVar70) {
                    dVar89 = dVar69;
                  }
                  dVar89 = dVar89 + dVar89;
                }
                dVar74 = pdVar33[lVar37] - pdVar59[lVar37];
                dVar65 = pdVar59[lVar37] - dVar1;
                if (0.0 <= dVar65 * dVar74) {
                  dVar93 = ABS(dVar74);
                  if (ABS(dVar65) <= ABS(dVar74)) {
                    dVar93 = ABS(dVar65);
                  }
                  dVar93 = dVar93 + dVar93;
                }
                dVar79 = 0.0;
                dVar71 = 0.0;
                if (0.0 <= dVar83 * dVar65) {
                  dVar71 = ABS(dVar65);
                  if (ABS(dVar83) <= ABS(dVar65)) {
                    dVar71 = ABS(dVar83);
                  }
                  dVar71 = dVar71 + dVar71;
                }
                dVar88 = pdVar43[lVar37] - pdVar27[lVar37];
                if (0.0 <= dVar81 * dVar88) {
                  dVar79 = ABS(dVar81);
                  if (ABS(dVar88) <= ABS(dVar81)) {
                    dVar79 = ABS(dVar88);
                  }
                  dVar79 = dVar79 + dVar79;
                }
                dVar68 = 0.0;
                dVar90 = 0.0;
                if (0.0 <= dVar83 * dVar65) {
                  dVar90 = ABS(dVar65);
                  if (ABS(dVar83) <= ABS(dVar65)) {
                    dVar90 = ABS(dVar83);
                  }
                  dVar90 = dVar90 + dVar90;
                }
                if (0.0 <= dVar83 * dVar81) {
                  if (dVar69 <= dVar70) {
                    dVar70 = dVar69;
                  }
                  dVar68 = dVar70 + dVar70;
                }
                dVar88 = (dVar88 + dVar81) * 0.5;
                dVar92 = (dVar65 + dVar83) * 0.5;
                auVar72._0_8_ = ABS(dVar88);
                auVar72._8_8_ = ABS(dVar92);
                auVar73._8_8_ = dVar90;
                auVar73._0_8_ = dVar79;
                auVar73 = minpd(auVar72,auVar73);
                dVar70 = pdVar56[lVar37];
                dVar69 = (dVar81 + dVar83) * 0.5;
                dVar81 = (dVar74 + dVar65) * 0.5;
                auVar67._0_8_ = (ulong)dVar69 & 0x8000000000000000;
                auVar67._8_8_ = (ulong)dVar81 & 0x8000000000000000;
                auVar76._0_8_ = ABS(dVar69);
                auVar76._8_8_ = ABS(dVar81);
                auVar77._8_4_ = SUB84(dVar93,0);
                auVar77._0_8_ = dVar89;
                auVar77._12_4_ = (int)((ulong)dVar93 >> 0x20);
                auVar77 = minpd(auVar76,auVar77);
                dVar93 = SUB168(auVar67 | _DAT_00601290,0);
                dVar89 = ABS(dVar92 * 1.3333333333333333 +
                             (auVar77._8_8_ * SUB168(auVar67 | _DAT_00601290,8) +
                             auVar77._0_8_ * dVar93) * -0.16666666666666666);
                if (dVar71 <= dVar89) {
                  dVar89 = dVar71;
                }
                auVar78._0_8_ = (ulong)dVar88 & 0x8000000000000000;
                auVar78._8_8_ = (ulong)dVar92 & 0x8000000000000000;
                dVar81 = SUB168(auVar78 | _DAT_00601290,8);
                dVar69 = ABS(dVar69 * 1.3333333333333333 +
                             (auVar73._8_8_ * dVar81 +
                             auVar73._0_8_ * SUB168(auVar78 | _DAT_00601290,0)) *
                             -0.16666666666666666);
                if (dVar68 <= dVar69) {
                  dVar69 = dVar68;
                }
                pdVar47[lVar37] = dVar69 * dVar93 * (1.0 - pdVar24[lVar37] * dVar64) * 0.5 + dVar2;
                pdVar53[lVar37] = dVar81 * dVar89 * (-1.0 - dVar70 * dVar64) * 0.5 + dVar1;
                lVar37 = lVar37 + 1;
              } while ((iVar55 - iVar3) + 1 != (int)lVar37);
            }
            pdVar53 = pdVar53 + lVar22;
            pdVar47 = pdVar47 + lVar9;
            pdVar24 = pdVar24 + lVar11;
            pdVar56 = pdVar56 + lVar11;
            pdVar27 = pdVar27 + lVar14;
            pdVar33 = pdVar33 + lVar14;
            pdVar43 = pdVar43 + lVar14;
            pdVar59 = pdVar59 + lVar14;
            pdVar58 = pdVar58 + lVar14;
            pdVar51 = pdVar51 + lVar14;
          }
          local_138 = local_138 + lVar7;
          local_128 = local_128 + lVar8;
          local_1d8 = local_1d8 + lVar10;
          pdVar44 = pdVar44 + lVar10;
          iVar21 = iVar21 + 1;
          iVar29 = iVar29 + 1;
          iVar40 = iVar40 + 1;
          pdVar39 = pdVar39 + lVar15;
          pdVar50 = pdVar50 + lVar15;
        }
        pdVar57 = pdVar57 + lVar17;
        pdVar26 = pdVar26 + lVar16;
        local_258 = local_258 + lVar46;
        pdVar54 = pdVar54 + lVar46;
        pdVar28 = pdVar28 + lVar46;
      }
      return;
    }
    iVar55 = (zebox->smallend).vect[2];
  }
  else {
    iVar4 = (zebox->bigend).vect[2];
  }
  lVar7 = Imz->jstride;
  lVar45 = Imz->kstride;
  lVar52 = (long)(zebox->smallend).vect[1];
  uVar35 = (ulong)(uint)ncomp;
  if (ncomp < 1) {
    uVar35 = 0;
  }
  lVar61 = (long)iVar55;
  iVar5 = (zebox->smallend).vect[0];
  lVar41 = (long)iVar5;
  lVar8 = Ipz->kstride;
  lVar9 = Ipz->jstride;
  lVar23 = (long)(vcc->begin).z;
  lVar10 = vcc->kstride;
  lVar11 = vcc->jstride;
  lVar32 = (lVar52 - (vcc->begin).y) * lVar11;
  lVar12 = vcc->nstride;
  lVar36 = (long)(vcc->begin).x;
  pdVar13 = vcc->p;
  lVar14 = q->jstride;
  lVar42 = (lVar52 - (q->begin).y) * lVar14;
  uVar6 = (q->begin).z;
  iVar48 = iVar3 - uVar6;
  iVar55 = iVar55 - uVar6;
  lVar15 = q->kstride;
  lVar46 = (long)(q->begin).x;
  local_118 = q->p;
  local_d0 = local_118 + (((int)((iVar20 - uVar6) + 2) * lVar15 + lVar42 + lVar41) - lVar46);
  local_d8 = local_118 + (((int)(iVar20 - uVar6) * lVar15 + lVar42 + lVar41) - lVar46);
  local_e0 = local_118 + (((int)(~uVar6 + iVar20) * lVar15 + lVar42 + lVar41) - lVar46);
  local_e8 = local_118 + (((iVar48 + -2) * lVar15 + lVar42 + lVar41) - lVar46);
  local_f0 = local_118 + ((iVar48 * lVar15 + lVar42 + lVar41) - lVar46);
  local_f8 = local_118 + (((iVar48 + 1) * lVar15 + lVar42 + lVar41) - lVar46);
  local_100 = local_118 + ((lVar42 + lVar41) - lVar46);
  pdVar28 = local_118 + ((((lVar61 + -1) - (long)(int)uVar6) * lVar15 + lVar42 + lVar41) - lVar46);
  local_118 = local_118 + (((lVar61 - (int)uVar6) * lVar15 + lVar42 + lVar41) - lVar46);
  lVar46 = q->nstride;
  local_230 = Ipz->p + ((lVar41 + ((lVar61 - (Ipz->begin).z) + -1) * lVar8 +
                                  (lVar52 - (Ipz->begin).y) * lVar9) - (long)(Ipz->begin).x);
  lVar16 = Ipz->nstride;
  local_228 = Imz->p + ((lVar41 + (lVar61 - (Imz->begin).z) * lVar45 +
                                  (lVar52 - (Imz->begin).y) * lVar7) - (long)(Imz->begin).x);
  lVar17 = Imz->nstride;
  iVar48 = (zebox->bigend).vect[0];
  iVar40 = (zebox->bigend).vect[1];
  lVar42 = lVar15 * 8;
  uVar84 = 0;
  uVar86 = 0x3ff00000;
  for (uVar60 = 0; uVar60 != uVar35; uVar60 = uVar60 + 1) {
    local_1c0 = local_230;
    local_1c8 = local_228;
    pdVar26 = pdVar28;
    pdVar54 = local_118;
    pdVar57 = pdVar13 + ((lVar41 + lVar12 * 2 + (lVar61 - lVar23) * lVar10 + lVar32) - lVar36);
    pdVar50 = pdVar13 + ((lVar41 + lVar12 * 2 + ((lVar61 + -1) - lVar23) * lVar10 + lVar32) - lVar36
                        );
    lVar49 = lVar61;
    iVar21 = iVar55 + -2;
    iVar25 = iVar55 + 2;
    iVar34 = iVar55 + -3;
    iVar31 = iVar55 + -1;
    iVar29 = iVar55;
    while (iVar29 = iVar29 + 1, lVar49 <= iVar4) {
      local_1e0 = (double *)(iVar31 * lVar42 + (long)local_100);
      pdVar43 = (double *)(iVar34 * lVar42 + (long)local_100);
      pdVar33 = (double *)(iVar25 * lVar42 + (long)local_100);
      pdVar59 = (double *)(iVar21 * lVar42 + (long)local_100);
      pdVar27 = (double *)(iVar29 * lVar42 + (long)local_100);
      iVar30 = (int)lVar49 + -1;
      local_1e8 = local_f8;
      local_258 = local_f0;
      local_1f0 = local_e8;
      local_2c0 = local_1c8;
      pdVar39 = pdVar50;
      pdVar44 = local_d8;
      pdVar24 = local_d0;
      pdVar47 = pdVar26;
      pdVar51 = pdVar54;
      pdVar53 = local_e0;
      pdVar56 = local_1c0;
      pdVar58 = pdVar57;
      for (lVar37 = lVar52; lVar37 <= iVar40; lVar37 = lVar37 + 1) {
        if (iVar5 <= iVar48) {
          bVar62 = pbc[uVar60].bc[2] - 3U < 2;
          bVar63 = pbc[uVar60].bc[5] - 3U < 2;
          lVar38 = 0;
          do {
            dVar1 = pdVar51[lVar38];
            dVar2 = pdVar47[lVar38];
            dVar89 = pdVar59[lVar38];
            dVar65 = dVar1 - dVar2;
            dVar74 = dVar2 - dVar89;
            dVar70 = 0.0;
            dVar81 = (dVar65 + dVar74) * 0.5;
            dVar69 = ABS(dVar65);
            dVar83 = ABS(dVar74);
            dVar93 = 0.0;
            if (0.0 <= dVar65 * dVar74) {
              dVar93 = dVar69;
              if (dVar83 <= dVar69) {
                dVar93 = dVar83;
              }
              dVar93 = dVar93 + dVar93;
            }
            dVar79 = pdVar27[lVar38];
            dVar88 = dVar79 - dVar1;
            dVar71 = pdVar33[lVar38] - dVar79;
            dVar90 = (dVar88 + dVar71) * 0.5;
            if (0.0 <= dVar88 * dVar71) {
              dVar70 = ABS(dVar71);
              if (ABS(dVar88) <= ABS(dVar71)) {
                dVar70 = ABS(dVar88);
              }
              dVar70 = dVar70 + dVar70;
            }
            dVar68 = (dVar65 + dVar88) * 0.5;
            dVar71 = 0.0;
            if (0.0 <= dVar65 * dVar88) {
              dVar71 = ABS(dVar88);
              if (ABS(dVar65) <= ABS(dVar88)) {
                dVar71 = ABS(dVar65);
              }
              dVar71 = dVar71 + dVar71;
            }
            dVar75 = (double)((ulong)dVar81 & 0x8000000000000000 | CONCAT44(uVar86,uVar84));
            dVar92 = ABS(dVar81);
            if (dVar93 <= ABS(dVar81)) {
              dVar92 = dVar93;
            }
            dVar92 = dVar92 * dVar75;
            dVar93 = (double)((ulong)dVar68 & 0x8000000000000000 | CONCAT44(uVar86,uVar84));
            uVar18 = (ulong)DAT_00601290;
            if (lVar49 == iVar20 && bVar62) {
              dVar71 = 0.0;
              if (0.0 <= (dVar65 + dVar65) * (dVar88 + dVar88)) {
                dVar70 = ABS(dVar65 + dVar65);
                dVar71 = ABS(dVar88 + dVar88);
                if (dVar70 <= dVar71) {
                  dVar71 = dVar70;
                }
              }
              dVar90 = pdVar33[lVar38] * -0.1 +
                       dVar79 * 0.6666666666666666 + dVar2 * -1.0666666666666667 + dVar1 * 0.5;
              dVar70 = (double)((ulong)dVar90 & 0x8000000000000000 | uVar18);
            }
            else {
              dVar91 = ABS(dVar90);
              if (dVar70 <= dVar91) {
                dVar91 = dVar70;
              }
              dVar91 = dVar91 * (double)((ulong)dVar90 & 0x8000000000000000 |
                                        CONCAT44(uVar86,uVar84));
              dVar70 = dVar93;
              if (lVar49 == (long)iVar20 + 1 && bVar62) {
                dVar90 = pdVar44[lVar38];
                dVar80 = dVar90 - pdVar53[lVar38];
                dVar92 = (dVar1 - dVar90) + (dVar1 - dVar90);
                dVar80 = dVar80 + dVar80;
                dVar82 = 0.0;
                if (0.0 <= dVar80 * dVar92) {
                  dVar82 = ABS(dVar92);
                  dVar80 = ABS(dVar80);
                  if (dVar80 <= dVar82) {
                    dVar82 = dVar80;
                  }
                }
                dVar90 = pdVar24[lVar38] * -0.1 +
                         dVar1 * 0.6666666666666666 +
                         pdVar53[lVar38] * -1.0666666666666667 + dVar90 * 0.5;
                dVar92 = ABS(dVar90);
                if (dVar82 <= dVar92) {
                  dVar92 = dVar82;
                }
                dVar92 = dVar92 * (double)((ulong)dVar90 & 0x8000000000000000 | uVar18);
                dVar90 = dVar68 * 1.3333333333333333 + (dVar91 + dVar92) * -0.16666666666666666;
              }
              else {
                dVar90 = dVar68 * 1.3333333333333333 + (dVar92 + dVar91) * -0.16666666666666666;
              }
            }
            dVar91 = pdVar58[lVar38];
            if (lVar49 != lVar22 || !bVar63) {
              if (lVar49 == lVar22 + -1 && bVar63) {
                dVar90 = local_258[lVar38];
                dVar82 = local_1e8[lVar38] - dVar90;
                dVar82 = dVar82 + dVar82;
                dVar80 = (dVar90 - dVar1) + (dVar90 - dVar1);
                uVar84 = 0;
                uVar86 = 0;
                if (0.0 <= dVar80 * dVar82) {
                  dVar82 = ABS(dVar82);
                  dVar80 = ABS(dVar80);
                  if (dVar80 <= dVar82) {
                    dVar82 = dVar80;
                  }
                  uVar84 = SUB84(dVar82,0);
                  uVar86 = (undefined4)((ulong)dVar82 >> 0x20);
                }
                dVar82 = local_1f0[lVar38] * 0.1 +
                         dVar1 * -0.6666666666666666 +
                         local_1e8[lVar38] * 1.0666666666666667 + dVar90 * -0.5;
                dVar90 = ABS(dVar82);
                if ((double)CONCAT44(uVar86,uVar84) <= dVar90) {
                  dVar90 = (double)CONCAT44(uVar86,uVar84);
                }
                dVar90 = dVar68 * 1.3333333333333333 +
                         (dVar92 + dVar90 * (double)((ulong)dVar82 & 0x8000000000000000 | uVar18)) *
                         -0.16666666666666666;
              }
            }
            else {
              dVar71 = 0.0;
              if (0.0 <= (dVar65 + dVar65) * (dVar88 + dVar88)) {
                dVar70 = ABS(dVar65 + dVar65);
                dVar71 = ABS(dVar88 + dVar88);
                if (dVar70 <= dVar71) {
                  dVar71 = dVar70;
                }
              }
              dVar90 = dVar89 * 0.1 +
                       dVar2 * -0.6666666666666666 + dVar79 * 1.0666666666666667 + dVar1 * -0.5;
              dVar70 = (double)((ulong)dVar90 & 0x8000000000000000 | uVar18);
            }
            dVar82 = dVar89 - pdVar43[lVar38];
            dVar66 = (dVar74 + dVar82) * 0.5;
            dVar92 = 0.0;
            dVar80 = 0.0;
            if (0.0 <= dVar74 * dVar82) {
              dVar80 = ABS(dVar74);
              if (ABS(dVar82) <= ABS(dVar74)) {
                dVar80 = ABS(dVar82);
              }
              dVar80 = dVar80 + dVar80;
            }
            if (0.0 <= dVar65 * dVar88) {
              dVar92 = ABS(dVar88);
              if (ABS(dVar65) <= ABS(dVar88)) {
                dVar92 = ABS(dVar65);
              }
              dVar92 = dVar92 + dVar92;
            }
            dVar82 = 0.0;
            if (0.0 <= dVar65 * dVar74) {
              if (dVar83 <= dVar69) {
                dVar69 = dVar83;
              }
              dVar82 = dVar69 + dVar69;
            }
            dVar69 = ABS(dVar66);
            if (dVar80 <= dVar69) {
              dVar69 = dVar80;
            }
            dVar69 = dVar69 * (double)((ulong)dVar66 & 0x8000000000000000 | 0x3ff0000000000000);
            uVar84 = (undefined4)DAT_00601290;
            uVar86 = DAT_00601290._4_4_;
            if (iVar20 == iVar30 && bVar62) {
              dVar82 = 0.0;
              if (0.0 <= (dVar74 + dVar74) * (dVar65 + dVar65)) {
                dVar82 = ABS(dVar65 + dVar65);
                dVar93 = ABS(dVar74 + dVar74);
                if (dVar93 <= dVar82) {
                  dVar82 = dVar93;
                }
              }
              dVar93 = dVar79 * -0.1 +
                       dVar1 * 0.6666666666666666 + dVar89 * -1.0666666666666667 + dVar2 * 0.5;
              dVar75 = (double)((ulong)dVar93 & 0x8000000000000000 | uVar18);
            }
            else {
              dVar83 = ABS(dVar68);
              if (dVar92 <= ABS(dVar68)) {
                dVar83 = dVar92;
              }
              if (iVar20 == (int)lVar49 + -2 && bVar62) {
                dVar69 = pdVar44[lVar38];
                dVar92 = dVar69 - pdVar53[lVar38];
                dVar68 = (dVar2 - dVar69) + (dVar2 - dVar69);
                dVar92 = dVar92 + dVar92;
                uVar85 = 0;
                uVar87 = 0;
                if (0.0 <= dVar92 * dVar68) {
                  dVar68 = ABS(dVar68);
                  dVar92 = ABS(dVar92);
                  if (dVar92 <= dVar68) {
                    dVar68 = dVar92;
                  }
                  uVar85 = SUB84(dVar68,0);
                  uVar87 = (undefined4)((ulong)dVar68 >> 0x20);
                }
                dVar68 = pdVar24[lVar38] * -0.1 +
                         dVar2 * 0.6666666666666666 +
                         pdVar53[lVar38] * -1.0666666666666667 + dVar69 * 0.5;
                dVar69 = ABS(dVar68);
                if ((double)CONCAT44(uVar87,uVar85) <= dVar69) {
                  dVar69 = (double)CONCAT44(uVar87,uVar85);
                }
                dVar69 = dVar69 * (double)((ulong)dVar68 & 0x8000000000000000 | uVar18);
                dVar93 = dVar81 * 1.3333333333333333 +
                         (dVar93 * dVar83 + dVar69) * -0.16666666666666666;
              }
              else {
                dVar93 = dVar81 * 1.3333333333333333 +
                         (dVar69 + dVar93 * dVar83) * -0.16666666666666666;
                uVar84 = 0;
                uVar86 = 0x3ff00000;
              }
            }
            if (iVar3 == iVar30 && bVar63) {
              dVar82 = 0.0;
              if (0.0 <= (dVar74 + dVar74) * (dVar65 + dVar65)) {
                dVar82 = ABS(dVar65 + dVar65);
                dVar93 = ABS(dVar74 + dVar74);
                if (dVar93 <= dVar82) {
                  dVar82 = dVar93;
                }
              }
              dVar93 = pdVar43[lVar38] * 0.1 +
                       dVar89 * -0.6666666666666666 + dVar1 * 1.0666666666666667 + dVar2 * -0.5;
              dVar75 = (double)((ulong)dVar93 & 0x8000000000000000 | CONCAT44(uVar86,uVar84));
            }
            else if (lVar49 == lVar22 && bVar63) {
              dVar83 = dVar1 - local_1e0[lVar38];
              dVar83 = dVar83 + dVar83;
              dVar93 = 0.0;
              if (0.0 <= dVar83 * (dVar88 + dVar88)) {
                dVar93 = ABS(dVar88 + dVar88);
                dVar83 = ABS(dVar83);
                if (dVar83 <= dVar93) {
                  dVar93 = dVar83;
                }
              }
              dVar83 = dVar89 * 0.1 +
                       local_1e0[lVar38] * -0.6666666666666666 +
                       dVar79 * 1.0666666666666667 + dVar1 * -0.5;
              dVar89 = ABS(dVar83);
              if (dVar93 <= dVar89) {
                dVar89 = dVar93;
              }
              dVar93 = dVar81 * 1.3333333333333333 +
                       (dVar69 + dVar89 * (double)((ulong)dVar83 & 0x8000000000000000 |
                                                  CONCAT44(uVar86,uVar84))) * -0.16666666666666666;
            }
            dVar89 = ABS(dVar90);
            if (dVar71 <= ABS(dVar90)) {
              dVar89 = dVar71;
            }
            dVar69 = ABS(dVar93);
            if (dVar82 <= ABS(dVar93)) {
              dVar69 = dVar82;
            }
            pdVar56[lVar38] = dVar69 * dVar75 * (1.0 - pdVar39[lVar38] * dVar64) * 0.5 + dVar2;
            local_2c0[lVar38] = dVar70 * dVar89 * (-1.0 - dVar91 * dVar64) * 0.5 + dVar1;
            lVar38 = lVar38 + 1;
          } while ((iVar48 - iVar5) + 1 != (int)lVar38);
        }
        local_2c0 = local_2c0 + lVar7;
        pdVar56 = pdVar56 + lVar9;
        pdVar39 = pdVar39 + lVar11;
        pdVar58 = pdVar58 + lVar11;
        pdVar24 = pdVar24 + lVar14;
        pdVar44 = pdVar44 + lVar14;
        pdVar53 = pdVar53 + lVar14;
        local_1f0 = local_1f0 + lVar14;
        local_258 = local_258 + lVar14;
        local_1e8 = local_1e8 + lVar14;
        local_1e0 = local_1e0 + lVar14;
        pdVar43 = pdVar43 + lVar14;
        pdVar33 = pdVar33 + lVar14;
        pdVar59 = pdVar59 + lVar14;
        pdVar27 = pdVar27 + lVar14;
        pdVar47 = pdVar47 + lVar14;
        pdVar51 = pdVar51 + lVar14;
      }
      local_1c8 = local_1c8 + lVar45;
      local_1c0 = local_1c0 + lVar8;
      pdVar50 = pdVar50 + lVar10;
      pdVar57 = pdVar57 + lVar10;
      iVar31 = iVar31 + 1;
      iVar34 = iVar34 + 1;
      iVar25 = iVar25 + 1;
      iVar21 = iVar21 + 1;
      pdVar26 = pdVar26 + lVar15;
      pdVar54 = pdVar54 + lVar15;
      lVar49 = lVar49 + 1;
    }
    local_228 = local_228 + lVar17;
    local_230 = local_230 + lVar16;
    local_d0 = local_d0 + lVar46;
    local_d8 = local_d8 + lVar46;
    local_e0 = local_e0 + lVar46;
    local_e8 = local_e8 + lVar46;
    local_f0 = local_f0 + lVar46;
    local_f8 = local_f8 + lVar46;
    local_100 = local_100 + lVar46;
    pdVar28 = pdVar28 + lVar46;
    local_118 = local_118 + lVar46;
  }
  return;
}

Assistant:

void
PLM::PredictVelOnZFace ( Box const& zebox, int ncomp,
                         Array4<Real> const& Imz, Array4<Real> const& Ipz,
                         Array4<Real const> const& q,
                         Array4<Real const> const& vcc,
                         const Geometry& geom,
                         Real dt,
                         Vector<BCRec> const& h_bcrec,
                         BCRec const* pbc)
{
    const Real dz = geom.CellSize(2);
    const Real dtdz = dt/dz;

    const Box& domain_box = geom.Domain();
    const int domain_klo = domain_box.smallEnd(2);
    const int domain_khi = domain_box.bigEnd(2);

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo = extdir_lohi.first;
    bool has_extdir_or_ho_hi = extdir_lohi.second;

    if ((has_extdir_or_ho_lo && domain_klo >= zebox.smallEnd(2)-1) ||
        (has_extdir_or_ho_hi && domain_khi <= zebox.bigEnd(2)))
    {
        amrex::ParallelFor(zebox, ncomp, [q,vcc,domain_klo,domain_khi,Ipz,Imz,dtdz,pbc]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            const auto& bc = pbc[n];
            bool extdir_or_ho_klo = (bc.lo(2) == BCType::ext_dir) ||
                                    (bc.lo(2) == BCType::hoextrap);
            bool extdir_or_ho_khi = (bc.hi(2) == BCType::ext_dir) ||
                                    (bc.hi(2) == BCType::hoextrap);

            int order = 4;

            Real wpls = q(i,j,k  ,n) + 0.5 * (-1.0 - vcc(i,j,k  ,2) * dtdz) *
                amrex_calc_zslope_extdir(i,j,k,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);
            Real wmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - vcc(i,j,k-1,2) * dtdz) *
                amrex_calc_zslope_extdir(i,j,k-1,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);


            Ipz(i,j,k-1,n) = wmns;
            Imz(i,j,k  ,n) = wpls;
        });
    }
    else
    {
        amrex::ParallelFor(zebox, ncomp, [q,vcc,Ipz,Imz,dtdz]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            int order = 4;

            Real wpls = q(i,j,k  ,n) + 0.5 * (-1.0 - vcc(i,j,k  ,2) * dtdz) *
                amrex_calc_zslope(i,j,k  ,n,order,q);
            Real wmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - vcc(i,j,k-1,2) * dtdz) *
                amrex_calc_zslope(i,j,k-1,n,order,q);

            Ipz(i,j,k-1,n) = wmns;
            Imz(i,j,k  ,n) = wpls;
        });
    }
}